

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

uint ConvertFromAutoRef(uint target,uint source)

{
  if (source != target) {
    do {
      if (*(uint *)(NULLC::commonLinker + 0x20c) <= source) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      source = *(uint *)(*(long *)(NULLC::commonLinker + 0x200) + 0x4c + (ulong)source * 0x50);
      if (source == 0) {
        return 0;
      }
    } while (source != target);
  }
  return 1;
}

Assistant:

unsigned ConvertFromAutoRef(unsigned int target, unsigned int source)
{
	if(source == target)
		return 1;
	while(NULLC::commonLinker->exTypes[source].baseType)
	{
		source = NULLC::commonLinker->exTypes[source].baseType;
		if(source == target)
			return 1;
	}
	return 0;
}